

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_sockfd.c
# Opt level: O1

void sfd_cb(void *arg,uint events)

{
  int iVar1;
  int iVar2;
  nni_aio *aio;
  uint events_00;
  
  nni_mtx_lock((nni_mtx *)((long)arg + 0xb0));
  if ((events & 0x38) != 0) {
    do {
      aio = (nni_aio *)nni_list_first((nni_list *)((long)arg + 0x78));
      if (aio == (nni_aio *)0x0) {
        aio = (nni_aio *)nni_list_first((nni_list *)((long)arg + 0x90));
        if (aio == (nni_aio *)0x0) goto LAB_0013124f;
      }
      nni_aio_list_remove(aio);
      nni_aio_finish_error(aio,NNG_ECONNSHUT);
    } while( true );
  }
  if ((events & 1) != 0) {
    sfd_doread((nni_sfd_conn *)arg);
  }
  if ((events & 4) != 0) {
    sfd_dowrite((nni_sfd_conn *)arg);
  }
  iVar1 = nni_list_empty((nni_list *)((long)arg + 0x90));
  iVar2 = nni_list_empty((nni_list *)((long)arg + 0x78));
  if ((*(char *)((long)arg + 0xa8) == '\0') &&
     (events_00 = (uint)(iVar2 == 0) + (uint)(iVar1 == 0) * 4, events_00 != 0)) {
    nni_posix_pfd_arm((nni_posix_pfd *)((long)arg + 0x38),events_00);
  }
LAB_001312c1:
  nni_mtx_unlock((nni_mtx *)((long)arg + 0xb0));
  return;
LAB_0013124f:
  nni_posix_pfd_close((nni_posix_pfd *)((long)arg + 0x38));
  goto LAB_001312c1;
}

Assistant:

static void
sfd_cb(void *arg, unsigned events)
{
	struct nni_sfd_conn *c = arg;

	if (events & (NNI_POLL_HUP | NNI_POLL_ERR | NNI_POLL_INVAL)) {
		sfd_error(c, NNG_ECONNSHUT);
		return;
	}
	nni_mtx_lock(&c->mtx);
	if ((events & NNI_POLL_IN) != 0) {
		sfd_doread(c);
	}
	if ((events & NNI_POLL_OUT) != 0) {
		sfd_dowrite(c);
	}
	events = 0;
	if (!nni_list_empty(&c->writeq)) {
		events |= NNI_POLL_OUT;
	}
	if (!nni_list_empty(&c->readq)) {
		events |= NNI_POLL_IN;
	}
	if ((!c->closed) && (events != 0)) {
		nni_posix_pfd_arm(&c->pfd, events);
	}
	nni_mtx_unlock(&c->mtx);
}